

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

Literals * __thiscall
anon_unknown.dwarf_5f52c::CtorEvalExternalInterface::callImport
          (Literals *__return_storage_ptr__,CtorEvalExternalInterface *this,Function *import,
          Literals *arguments)

{
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var1;
  string *psVar2;
  long *plVar3;
  size_type *psVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  char *extraout_RDX_08;
  char *pcVar5;
  initializer_list<wasm::Literal> init;
  initializer_list<wasm::Literal> init_00;
  initializer_list<wasm::Literal> init_01;
  initializer_list<wasm::Literal> init_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string extra;
  
  wasm::IString::interned(0x16,"wasi_snapshot_preview1",0);
  if (((anonymous_namespace)::ignoreExternalInput == '\x01') &&
     ((import->super_Importable).module.super_IString.str._M_str == extraout_RDX)) {
    wasm::IString::interned(0x11,"environ_sizes_get",0);
    if ((import->super_Importable).base.super_IString.str._M_str == extraout_RDX_00) {
      if ((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
           (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 2) &&
         ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id == 2)) {
        wasm::HeapType::getSignature();
        if (extraout_RDX_05 == 2) {
          if ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id != 2) {
LAB_001286d7:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x120,"int32_t wasm::Literal::geti32() const");
          }
          _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
               (((this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
          (*(this->super_ExternalInterface)._vptr_ExternalInterface[0x18])
                    (this,(long)(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0]
                                .field_0.i32,0,
                     *(undefined8 *)
                      _Var1._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
                     *(undefined8 *)
                      ((long)_Var1._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8));
          local_50 = (undefined1  [8])((ulong)(uint)local_50._4_4_ << 0x20);
          extra._M_string_length = 2;
          init_00._M_len = 1;
          init_00._M_array = (iterator)local_50;
          wasm::Literals::Literals(__return_storage_ptr__,init_00);
LAB_001285ee:
          wasm::Literal::~Literal((Literal *)local_50);
          return __return_storage_ptr__;
        }
      }
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_150 = local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"wasi environ_sizes_get has wrong sig","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_150,local_150 + local_148);
      __cxa_throw(psVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
    wasm::IString::interned(0xb,"environ_get",0);
    if ((import->super_Importable).base.super_IString.str._M_str == extraout_RDX_01) {
      if ((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
           (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 2) &&
         ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id == 2)) {
        wasm::HeapType::getSignature();
        if (extraout_RDX_06 == 2) {
          local_50 = (undefined1  [8])((ulong)(uint)local_50._4_4_ << 0x20);
          extra._M_string_length = 2;
          init_01._M_len = 1;
          init_01._M_array = (iterator)local_50;
          wasm::Literals::Literals(__return_storage_ptr__,init_01);
          goto LAB_001285ee;
        }
      }
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"wasi environ_get has wrong sig","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_130,local_130 + local_128);
      __cxa_throw(psVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
    wasm::IString::interned(0xe,"args_sizes_get",0);
    if ((import->super_Importable).base.super_IString.str._M_str == extraout_RDX_02) {
      if ((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
           (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 2) &&
         ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id == 2)) {
        wasm::HeapType::getSignature();
        if (extraout_RDX_07 == 2) {
          if ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id != 2)
          goto LAB_001286d7;
          _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
               (((this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
          (*(this->super_ExternalInterface)._vptr_ExternalInterface[0x18])
                    (this,(long)(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0]
                                .field_0.i32,0,
                     *(undefined8 *)
                      _Var1._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
                     *(undefined8 *)
                      ((long)_Var1._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8));
          local_50 = (undefined1  [8])((ulong)(uint)local_50._4_4_ << 0x20);
          extra._M_string_length = 2;
          init_02._M_len = 1;
          init_02._M_array = (iterator)local_50;
          wasm::Literals::Literals(__return_storage_ptr__,init_02);
          goto LAB_001285ee;
        }
      }
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"wasi args_sizes_get has wrong sig","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_110,local_110 + local_108);
      __cxa_throw(psVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
    wasm::IString::interned(8,"args_get",0);
    if ((import->super_Importable).base.super_IString.str._M_str == extraout_RDX_03) {
      if ((((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
           (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 2) &&
         ((arguments->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id == 2)) {
        wasm::HeapType::getSignature();
        if (extraout_RDX_04 == 2) {
          local_50 = (undefined1  [8])((ulong)(uint)local_50._4_4_ << 0x20);
          extra._M_string_length = 2;
          init._M_len = 1;
          init._M_array = (iterator)local_50;
          wasm::Literals::Literals(__return_storage_ptr__,init);
          goto LAB_001285ee;
        }
      }
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"wasi args_get has wrong sig","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_f0,local_f0 + local_e8);
      __cxa_throw(psVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
  }
  local_50 = (undefined1  [8])&extra._M_string_length;
  extra._M_dataplus._M_p = (pointer)0x0;
  extra._M_string_length = extra._M_string_length & 0xffffffffffffff00;
  pcVar5 = (import->super_Importable).module.super_IString.str._M_str;
  if (pcVar5 == _sqrt) {
    wasm::IString::interned(0xd,"___cxa_atexit",0);
    if ((import->super_Importable).base.super_IString.str._M_str != extraout_RDX_08) {
      pcVar5 = (import->super_Importable).module.super_IString.str._M_str;
      goto LAB_0012885c;
    }
    pcVar5 = 
    "\n       recommendation: build with -s NO_EXIT_RUNTIME=1 so that calls to atexit are not emitted"
    ;
  }
  else {
LAB_0012885c:
    if ((pcVar5 != extraout_RDX) || ((anonymous_namespace)::ignoreExternalInput != '\0'))
    goto LAB_0012887a;
    pcVar5 = "\n       recommendation: consider --ignore-external-input";
  }
  std::__cxx11::string::operator=((string *)local_50,pcVar5);
LAB_0012887a:
  psVar2 = (string *)__cxa_allocate_exception(0x20);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"call import: ","");
  pcVar5 = (import->super_Importable).module.super_IString.str._M_str;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,pcVar5,
             pcVar5 + (import->super_Importable).module.super_IString.str._M_len);
  std::operator+(&local_190,&local_90,&local_d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_70._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70.field_2._8_4_ = (undefined4)plVar3[3];
    local_70.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar4;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar5 = (import->super_Importable).base.super_IString.str._M_str;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,pcVar5,
             pcVar5 + (import->super_Importable).base.super_IString.str._M_len);
  std::operator+(&local_1b0,&local_70,&local_b0);
  std::operator+(&local_170,&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            (psVar2,local_170._M_dataplus._M_p,
             local_170._M_dataplus._M_p + local_170._M_string_length);
  __cxa_throw(psVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

Literals callImport(Function* import, const Literals& arguments) override {
    Name WASI("wasi_snapshot_preview1");

    if (ignoreExternalInput) {
      if (import->module == WASI) {
        if (import->base == "environ_sizes_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi environ_sizes_get has wrong sig");
          }

          // Write out a count of i32(0) and return __WASI_ERRNO_SUCCESS (0).
          store32(arguments[0].geti32(), 0, wasm->memories[0]->name);
          return {Literal(int32_t(0))};
        }

        if (import->base == "environ_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi environ_get has wrong sig");
          }

          // Just return __WASI_ERRNO_SUCCESS (0).
          return {Literal(int32_t(0))};
        }

        if (import->base == "args_sizes_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi args_sizes_get has wrong sig");
          }

          // Write out an argc of i32(0) and return a __WASI_ERRNO_SUCCESS (0).
          store32(arguments[0].geti32(), 0, wasm->memories[0]->name);
          return {Literal(int32_t(0))};
        }

        if (import->base == "args_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi args_get has wrong sig");
          }

          // Just return __WASI_ERRNO_SUCCESS (0).
          return {Literal(int32_t(0))};
        }

        // Otherwise, we don't recognize this import; continue normally to
        // error.
      }
    }

    std::string extra;
    if (import->module == ENV && import->base == "___cxa_atexit") {
      extra = RECOMMENDATION "build with -s NO_EXIT_RUNTIME=1 so that calls "
                             "to atexit are not emitted";
    } else if (import->module == WASI && !ignoreExternalInput) {
      extra = RECOMMENDATION "consider --ignore-external-input";
    }
    throw FailToEvalException(std::string("call import: ") +
                              import->module.toString() + "." +
                              import->base.toString() + extra);
  }